

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<unsigned_int,false>(phf *phf,uint *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  int iVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  undefined1 auVar9 [12];
  uint uVar10;
  uint uVar11;
  size_t __nmemb;
  size_t sVar12;
  int *__base;
  void *__ptr;
  uint32_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  ulong uVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  size_t __nmemb_00;
  size_t sVar22;
  int *piVar23;
  int *piVar24;
  int *piVar25;
  uint32_t uVar26;
  ulong uVar27;
  void *local_40;
  
  __nmemb_00 = n + (n == 0);
  uVar17 = l + (l == 0);
  sVar12 = 100;
  if (a < 100) {
    sVar12 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((__nmemb_00 + uVar17) - 1) / uVar17);
  sVar12 = phf_primeup((__nmemb_00 * 100) / (sVar12 + (sVar12 == 0)));
  if (sVar12 == 0 || __nmemb == 0) {
    return 0x22;
  }
  __base = (int *)calloc(__nmemb_00,0x10);
  if ((__base == (int *)0x0) || (local_40 = calloc(__nmemb,8), local_40 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_40 = (void *)0x0;
  }
  else {
    if (n != 0) {
      plVar18 = (long *)(__base + 2);
      sVar22 = 0;
      do {
        uVar11 = k[sVar22];
        uVar10 = (uVar11 * -0x3361d2af >> 0x11 | uVar11 * 0x16a88000) * 0x1b873593 ^ seed;
        uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
        uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
        uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = __nmemb;
        auVar9._4_8_ = 0;
        auVar9._0_4_ = uVar10 >> 0x10 ^ uVar10;
        lVar19 = SUB128(auVar9 % auVar4,0);
        *(uint *)(plVar18 + -1) = uVar11;
        *(int *)((long)plVar18 + -4) = SUB124(auVar9 % auVar4,0);
        plVar1 = (long *)((long)local_40 + lVar19 * 8);
        *plVar1 = *plVar1 + 1;
        *plVar18 = (long)((long)local_40 + lVar19 * 8);
        sVar22 = sVar22 + 1;
        plVar18 = plVar18 + 2;
      } while (n != sVar22);
    }
    qsort(__base,__nmemb_00,0x10,phf_keycmp<unsigned_int>);
    uVar17 = sVar12 + 0x3f >> 6;
    __ptr = calloc(uVar17 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar13 = (uint32_t *)calloc(__nmemb,4);
      if (puVar13 != (uint32_t *)0x0) {
        iVar3 = 0;
        if ((long)n < 1) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          piVar16 = __base;
          do {
            lVar19 = **(long **)(piVar16 + 2);
            if (lVar19 == 0) break;
            piVar25 = piVar16 + lVar19 * 4;
            uVar27 = 1;
            while (uVar26 = (uint32_t)uVar27, 0 < lVar19) {
              uVar11 = (uVar26 * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000) * 0x1b873593 ^ seed;
              uVar11 = (uVar11 << 0xd | uVar11 >> 0x13) * 5 + 0xe6546b64;
              piVar23 = piVar16;
              while( true ) {
                uVar10 = ((uint)(*piVar23 * -0x3361d2af) >> 0x11 | *piVar23 * 0x16a88000) *
                         0x1b873593 ^ uVar11;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = sVar12;
                auVar5 = ZEXT416(uVar10 >> 0x10 ^ uVar10) % auVar5;
                uVar20 = auVar5._0_8_;
                uVar14 = uVar20 >> 6 & 0x3ffffff;
                uVar21 = 1L << (auVar5[0] & 0x3f);
                piVar24 = piVar16;
                if (((*(ulong *)((long)__ptr + uVar14 * 8) >> (uVar20 & 0x3f) & 1) != 0) ||
                   (uVar20 = *(ulong *)((long)__ptr + uVar14 * 8 + uVar17 * 8),
                   (uVar20 & uVar21) != 0)) break;
                *(ulong *)((long)__ptr + uVar14 * 8 + uVar17 * 8) = uVar20 | uVar21;
                piVar23 = piVar23 + 4;
                if (piVar25 <= piVar23) goto LAB_00157537;
              }
              do {
                uVar10 = ((uint)(*piVar24 * -0x3361d2af) >> 0x11 | *piVar24 * 0x16a88000) *
                         0x1b873593 ^ uVar11;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = sVar12;
                auVar6 = ZEXT416(uVar10 >> 0x10 ^ uVar10) % auVar6;
                bVar8 = auVar6[0] & 0x3f;
                puVar2 = (ulong *)((long)__ptr + (auVar6._0_8_ >> 6 & 0x3ffffff) * 8 + uVar17 * 8);
                *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                piVar24 = piVar24 + 4;
              } while (piVar24 < piVar25);
              uVar27 = uVar27 + 1;
            }
LAB_00157537:
            if (0 < lVar19) {
              uVar11 = (uVar26 * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000) * 0x1b873593 ^ seed;
              piVar23 = piVar16;
              do {
                uVar10 = ((uint)(*piVar23 * -0x3361d2af) >> 0x11 | *piVar23 * 0x16a88000) *
                         0x1b873593 ^ (uVar11 << 0xd | uVar11 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = sVar12;
                auVar7 = ZEXT416(uVar10 >> 0x10 ^ uVar10) % auVar7;
                puVar2 = (ulong *)((long)__ptr + (auVar7._0_8_ >> 6 & 0x3ffffff) * 8);
                *puVar2 = *puVar2 | 1L << (auVar7[0] & 0x3f);
                piVar23 = piVar23 + 4;
              } while (piVar23 < piVar25);
            }
            uVar15 = uVar15 & 0xffffffff;
            if (uVar15 < uVar27) {
              uVar15 = uVar27;
            }
            puVar13[(uint)piVar16[1]] = uVar26;
            piVar16 = piVar25;
          } while (piVar25 < __base + n * 4);
          uVar15 = uVar15 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar12;
        phf->g = puVar13;
        phf->d_max = uVar15;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00157614;
      }
    }
  }
  piVar16 = __errno_location();
  iVar3 = *piVar16;
LAB_00157614:
  free(__ptr);
  free(local_40);
  free(__base);
  return iVar3;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}